

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.c
# Opt level: O3

void bench_sign_run(void *arg,int iters)

{
  int iVar1;
  long lVar2;
  size_t siglen;
  uchar sig [74];
  secp256k1_ecdsa_signature signature;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined1 local_70 [64];
  
  if (0 < iters) {
    do {
      local_d0 = 0x4a;
      lVar2 = *arg;
      iVar1 = secp256k1_ecdsa_sign
                        (lVar2,local_70,(undefined8 *)((long)arg + 8),
                         (undefined8 *)((long)arg + 0x28),0,0);
      if (iVar1 == 0) {
        bench_sign_run_cold_2();
LAB_001037e0:
        bench_sign_run_cold_1();
        *(undefined8 *)(lVar2 + 8) = 0x807060504030201;
        *(undefined8 *)(lVar2 + 0x10) = 0x100f0e0d0c0b0a09;
        *(undefined8 *)(lVar2 + 0x18) = 0x1817161514131211;
        *(undefined8 *)(lVar2 + 0x20) = 0x201f1e1d1c1b1a19;
        *(undefined8 *)(lVar2 + 0x28) = 0x4847464544434241;
        *(undefined8 *)(lVar2 + 0x30) = 0x504f4e4d4c4b4a49;
        *(undefined8 *)(lVar2 + 0x38) = 0x5857565554535251;
        *(undefined8 *)(lVar2 + 0x40) = 0x605f5e5d5c5b5a59;
        return;
      }
      lVar2 = *arg;
      iVar1 = secp256k1_ecdsa_signature_serialize_der(lVar2,&local_c8,&local_d0,local_70);
      if (iVar1 == 0) goto LAB_001037e0;
      *(undefined8 *)((long)arg + 0x18) = local_b8;
      *(undefined8 *)((long)arg + 0x20) = uStack_b0;
      *(undefined8 *)((long)arg + 8) = local_c8;
      *(undefined8 *)((long)arg + 0x10) = uStack_c0;
      *(undefined8 *)((long)arg + 0x38) = local_98;
      *(undefined8 *)((long)arg + 0x40) = uStack_90;
      *(undefined8 *)((long)arg + 0x28) = local_a8;
      *(undefined8 *)((long)arg + 0x30) = uStack_a0;
      iters = iters + -1;
    } while (iters != 0);
  }
  return;
}

Assistant:

static void bench_sign_run(void* arg, int iters) {
    int i;
    bench_data *data = (bench_data*)arg;

    unsigned char sig[74];
    for (i = 0; i < iters; i++) {
        size_t siglen = 74;
        int j;
        secp256k1_ecdsa_signature signature;
        CHECK(secp256k1_ecdsa_sign(data->ctx, &signature, data->msg, data->key, NULL, NULL));
        CHECK(secp256k1_ecdsa_signature_serialize_der(data->ctx, sig, &siglen, &signature));
        for (j = 0; j < 32; j++) {
            data->msg[j] = sig[j];
            data->key[j] = sig[j + 32];
        }
    }
}